

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O0

void duckdb::DateDiff::
     BinaryExecute<duckdb::date_t,duckdb::date_t,long,duckdb::DateDiff::MilleniumOperator>
               (Vector *left,Vector *right,Vector *result,idx_t count)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  
  BinaryExecutor::
  ExecuteWithNulls<duckdb::date_t,duckdb::date_t,long,duckdb::DateDiff::BinaryExecute<duckdb::date_t,duckdb::date_t,long,duckdb::DateDiff::MilleniumOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_>
            (in_RDI,in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

static inline void BinaryExecute(Vector &left, Vector &right, Vector &result, idx_t count) {
		BinaryExecutor::ExecuteWithNulls<TA, TB, TR>(
		    left, right, result, count, [&](TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
			    if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
				    return OP::template Operation<TA, TB, TR>(startdate, enddate);
			    } else {
				    mask.SetInvalid(idx);
				    return TR();
			    }
		    });
	}